

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertion_sort.h
# Opt level: O0

void insertion_sort(uchar **strings,int n,size_t depth)

{
  uchar *puVar1;
  bool bVar2;
  byte local_49;
  byte *local_48;
  uchar *t;
  uchar *s;
  uchar *tmp;
  uchar **j;
  uchar **i;
  size_t depth_local;
  int n_local;
  uchar **strings_local;
  
  j = strings + 1;
  depth_local._4_4_ = n;
  do {
    depth_local._4_4_ = depth_local._4_4_ + -1;
    if (depth_local._4_4_ < 1) {
      return;
    }
    tmp = (uchar *)j;
    puVar1 = *j;
    for (; strings < tmp; tmp = tmp + -8) {
      t = (uchar *)(*(long *)(tmp + -8) + depth);
      local_48 = puVar1 + depth;
      while( true ) {
        local_49 = 0;
        if (*t == *local_48) {
          bVar2 = is_end<unsigned_char>(*t);
          local_49 = bVar2 ^ 0xff;
        }
        if ((local_49 & 1) == 0) break;
        t = t + 1;
        local_48 = local_48 + 1;
      }
      if (*t <= *local_48) break;
      *(undefined8 *)tmp = *(undefined8 *)(tmp + -8);
    }
    *(uchar **)tmp = puVar1;
    j = j + 1;
  } while( true );
}

Assistant:

static inline void
insertion_sort(unsigned char** strings, int n, size_t depth)
{
	for (unsigned char** i = strings + 1; --n > 0; ++i) {
		unsigned char** j = i;
		unsigned char* tmp = *i;
		while (j > strings) {
			unsigned char* s = *(j-1)+depth;
			unsigned char* t = tmp+depth;
			while (*s == *t and not is_end(*s)) {
				++s;
				++t;
			}
			if (*s <= *t) break;
			*j = *(j-1);
			--j;
		}
		*j = tmp;
	}
}